

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_store_scalar(Parser *this,csubstr s,flag_t is_quoted)

{
  State *pSVar1;
  Location loc;
  bool bVar2;
  error_flags eVar3;
  undefined4 in_ECX;
  size_t in_RDX;
  char *in_RSI;
  Parser *in_RDI;
  undefined1 in_stack_00000000 [24];
  size_t in_stack_ffffffffffffff88;
  Parser *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  Location *in_stack_ffffffffffffffa0;
  size_t local_48;
  Parser *pPStack_40;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar2 = has_none(in_RDI,0x200);
  if (!bVar2) {
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                       (size_t)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    loc.super_LineCol.line = in_RDX;
    loc.super_LineCol.offset = (size_t)in_RSI;
    loc._16_24_ = in_stack_00000000;
    error<29ul>((char (*) [29])CONCAT44(in_ECX,in_stack_ffffffffffffffe0),loc);
    in_stack_ffffffffffffff88 = local_48;
    in_stack_ffffffffffffff90 = pPStack_40;
  }
  add_flags(in_stack_ffffffffffffff90,(flag_t)(in_stack_ffffffffffffff88 >> 0x20));
  pSVar1 = in_RDI->m_state;
  (pSVar1->scalar).str = in_RSI;
  (pSVar1->scalar).len = in_RDX;
  return;
}

Assistant:

void Parser::_store_scalar(csubstr s, flag_t is_quoted)
{
    _c4dbgpf("state[{}]: storing scalar '{}' (flag: {}) (old scalar='{}')",
             m_state-m_stack.begin(), s, m_state->flags & SSCL, m_state->scalar);
    RYML_CHECK(has_none(SSCL));
    add_flags(SSCL | (is_quoted * QSCL));
    m_state->scalar = s;
}